

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool cmSystemTools::GuessLibrarySOName(string *fullPath,string *soname)

{
  ulong uVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  string name;
  cmELF elf;
  string local_88;
  long *local_68;
  size_t local_60;
  long local_58 [2];
  cmELF local_48;
  
  cmELF::cmELF(&local_48,(fullPath->_M_dataplus)._M_p);
  bVar3 = cmELF::Valid(&local_48);
  if (bVar3) {
    bVar3 = cmELF::GetSOName(&local_48,soname);
    goto LAB_003589f8;
  }
  bVar3 = cmsys::SystemTools::FileIsSymlink(fullPath);
  if (bVar3) {
    bVar3 = cmsys::SystemTools::ReadSymlink(fullPath,soname);
    if (bVar3) {
      cmsys::SystemTools::GetFilenamePath(&local_88,soname);
      sVar2 = local_88._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if (sVar2 == 0) {
        cmsys::SystemTools::GetFilenameName(&local_88,fullPath);
        sVar2 = local_88._M_string_length;
        uVar1 = soname->_M_string_length;
        if (local_88._M_string_length < uVar1) {
          std::__cxx11::string::substr((ulong)&local_68,(ulong)soname);
          if (local_60 != local_88._M_string_length) goto LAB_00358a61;
          if (local_60 == 0) {
            bVar3 = true;
          }
          else {
            iVar4 = bcmp(local_68,local_88._M_dataplus._M_p,local_60);
            bVar3 = iVar4 == 0;
          }
        }
        else {
LAB_00358a61:
          bVar3 = false;
        }
        if ((sVar2 < uVar1) && (local_68 != local_58)) {
          operator_delete(local_68,local_58[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        goto LAB_003589f8;
      }
    }
  }
  bVar3 = false;
LAB_003589f8:
  cmELF::~cmELF(&local_48);
  return bVar3;
}

Assistant:

bool cmSystemTools::GuessLibrarySOName(std::string const& fullPath,
                                       std::string& soname)
{
  // For ELF shared libraries use a real parser to get the correct
  // soname.
#if defined(CMAKE_USE_ELF_PARSER)
  cmELF elf(fullPath.c_str());
  if(elf)
    {
    return elf.GetSOName(soname);
    }
#endif

  // If the file is not a symlink we have no guess for its soname.
  if(!cmSystemTools::FileIsSymlink(fullPath))
    {
    return false;
    }
  if(!cmSystemTools::ReadSymlink(fullPath, soname))
    {
    return false;
    }

  // If the symlink has a path component we have no guess for the soname.
  if(!cmSystemTools::GetFilenamePath(soname).empty())
    {
    return false;
    }

  // If the symlink points at an extended version of the same name
  // assume it is the soname.
  std::string name = cmSystemTools::GetFilenameName(fullPath);
  if(soname.length() > name.length() &&
     soname.substr(0, name.length()) == name)
    {
    return true;
    }
  return false;
}